

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O3

int fftsad(fitsfile *mfptr,HDUtracker *HDU,int *newPosition,char *newFileName)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *__dest;
  char *__dest_00;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  int hdunum;
  char filename2 [1025];
  char filename1 [1025];
  int local_860;
  int local_85c;
  int *local_858;
  char *local_850;
  char local_848 [1040];
  char local_438 [1032];
  
  local_85c = 0;
  local_858 = newPosition;
  local_850 = newFileName;
  ffghdn(mfptr,&local_860);
  local_85c = ffflnm(mfptr,local_438,&local_85c);
  iVar2 = ffrtnm(local_438,local_848,&local_85c);
  iVar6 = local_860;
  iVar1 = HDU->nHDU;
  uVar4 = (ulong)iVar1;
  local_85c = iVar2;
  if ((long)uVar4 < 1) {
    uVar5 = 0;
LAB_001b7bf2:
    if ((int)uVar5 != iVar1) {
      local_85c = 0x15a;
      if (local_858 != (int *)0x0) {
        *local_858 = HDU->newPosition[uVar5 & 0xffffffff];
      }
      if (local_850 == (char *)0x0) {
        return 0x15a;
      }
      strcpy(local_850,HDU->newFilename[uVar5 & 0xffffffff]);
      return 0x15a;
    }
  }
  else {
    uVar5 = 0;
    do {
      if ((HDU->position[uVar5] == iVar6) &&
         (iVar3 = strcmp(HDU->filename[uVar5],local_848), iVar3 == 0)) goto LAB_001b7bf2;
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
  }
  iVar6 = 0x159;
  if (iVar1 != 1000) {
    __dest = (char *)malloc(0x401);
    HDU->filename[uVar4] = __dest;
    iVar6 = 0x71;
    if (__dest != (char *)0x0) {
      __dest_00 = (char *)malloc(0x401);
      HDU->newFilename[uVar4] = __dest_00;
      if (__dest_00 == (char *)0x0) {
        free(__dest);
      }
      else {
        HDU->position[uVar4] = local_860;
        HDU->newPosition[uVar4] = local_860;
        strcpy(__dest,local_848);
        strcpy(__dest_00,local_848);
        HDU->nHDU = iVar1 + 1;
        iVar6 = iVar2;
      }
    }
  }
  return iVar6;
}

Assistant:

int fftsad(fitsfile   *mfptr,       /* pointer to an member HDU             */
	   HDUtracker *HDU,         /* pointer to an HDU tracker struct     */
	   int        *newPosition, /* new HDU position of the member HDU   */
	   char       *newFileName) /* file containing member HDU           */

/*
  add an HDU to the HDUtracker struct pointed to by HDU. The HDU is only 
  added if it does not already reside in the HDUtracker. If it already
  resides in the HDUtracker then the new HDU postion and file name are
  returned in  newPosition and newFileName (if != NULL)
*/

{
  int i;
  int hdunum;
  int status = 0;

  char filename1[FLEN_FILENAME];
  char filename2[FLEN_FILENAME];

  do
    {
      /* retrieve the HDU's position within the FITS file */

      fits_get_hdu_num(mfptr,&hdunum);
      
      /* retrieve the HDU's file name */
      
      status = fits_file_name(mfptr,filename1,&status);
      
      /* parse the file name and construct the "standard" URL for it */
      
      status = ffrtnm(filename1,filename2,&status);
      
      /* 
	 examine all the existing HDUs in the HDUtracker an see if this HDU
	 has already been registered
      */

      for(i = 0; 
       i < HDU->nHDU &&  !(HDU->position[i] == hdunum 
			   && strcmp(HDU->filename[i],filename2) == 0);
	  ++i);

      if(i != HDU->nHDU) 
	{
	  status = HDU_ALREADY_TRACKED;
	  if(newPosition != NULL) *newPosition = HDU->newPosition[i];
	  if(newFileName != NULL) strcpy(newFileName,HDU->newFilename[i]);
	  continue;
	}

      if(HDU->nHDU == MAX_HDU_TRACKER) 
	{
	  status = TOO_MANY_HDUS_TRACKED;
	  continue;
	}

      HDU->filename[i] = (char*) malloc(FLEN_FILENAME * sizeof(char));

      if(HDU->filename[i] == NULL)
	{
	  status = MEMORY_ALLOCATION;
	  continue;
	}

      HDU->newFilename[i] = (char*) malloc(FLEN_FILENAME * sizeof(char));

      if(HDU->newFilename[i] == NULL)
	{
	  status = MEMORY_ALLOCATION;
	  free(HDU->filename[i]);
	  continue;
	}

      HDU->position[i]    = hdunum;
      HDU->newPosition[i] = hdunum;

      strcpy(HDU->filename[i],filename2);
      strcpy(HDU->newFilename[i],filename2);
 
       ++(HDU->nHDU);

    }while(0);

  return(status);
}